

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString StringFromOrdinalNumber(uint number)

{
  char *pcVar1;
  uint uVar2;
  uint in_ESI;
  undefined4 in_register_0000003c;
  SimpleString SVar3;
  
  pcVar1 = "th";
  if (2 < in_ESI - 0xb) {
    uVar2 = in_ESI % 10 - 1;
    if (uVar2 < 3) {
      pcVar1 = &DAT_0013d940 + *(int *)(&DAT_0013d940 + (ulong)uVar2 * 4);
    }
  }
  SVar3 = StringFromFormat((char *)CONCAT44(in_register_0000003c,number),"%u%s",(ulong)in_ESI,pcVar1
                          );
  SVar3.buffer_ = (char *)CONCAT44(in_register_0000003c,number);
  return SVar3;
}

Assistant:

SimpleString StringFromOrdinalNumber(unsigned int number)
{
    unsigned int onesDigit = number % 10;

    const char* suffix;
    if (number >= 11 && number <= 13) {
        suffix = "th";
    } else if (3 == onesDigit) {
        suffix = "rd";
    } else if (2 == onesDigit) {
        suffix = "nd";
    } else if (1 == onesDigit) {
        suffix = "st";
    } else {
        suffix = "th";
    }

    return StringFromFormat("%u%s", number, suffix);
}